

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_find(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_INT *found)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_STATUS RVar4;
  long lVar5;
  
  *found = -1;
  RVar4 = 5;
  if (((-1 < node) && (pRVar2 = ref_geom->ref_adj, node < pRVar2->nnode)) &&
     (lVar5 = (long)pRVar2->first[(uint)node], lVar5 != -1)) {
    pRVar3 = pRVar2->item + lVar5;
    while( true ) {
      iVar1 = pRVar3->ref;
      if ((ref_geom->descr[(long)iVar1 * 6] == type) &&
         (ref_geom->descr[(int)(iVar1 * 6 | 1)] == id)) break;
      pRVar3 = ref_geom->ref_adj->item;
      lVar5 = (long)pRVar3[(int)lVar5].next;
      if (lVar5 == -1) {
        return 5;
      }
      pRVar3 = pRVar3 + lVar5;
    }
    *found = iVar1;
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_find(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                 REF_INT id, REF_INT *found) {
  REF_INT item, geom;
  *found = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom) &&
        id == ref_geom_id(ref_geom, geom)) {
      *found = geom;
      return REF_SUCCESS;
    }
  }
  return REF_NOT_FOUND;
}